

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceMesh::drawPick(SurfaceMesh *this)

{
  bool bVar1;
  BackFacePolicy *pBVar2;
  element_type *peVar3;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDI;
  SurfaceMesh *in_stack_00000220;
  ShaderProgram *in_stack_00000518;
  Structure *in_stack_00000520;
  nullptr_t in_stack_ffffffffffffffe8;
  long *plVar4;
  
  bVar1 = Structure::isEnabled((Structure *)0x470268);
  if (bVar1) {
    bVar1 = std::operator==((shared_ptr<polyscope::render::ShaderProgram> *)in_RDI,
                            in_stack_ffffffffffffffe8);
    if (bVar1) {
      preparePick(in_stack_00000220);
    }
    plVar4 = render::engine;
    pBVar2 = PersistentValue<polyscope::BackFacePolicy>::get
                       ((PersistentValue<polyscope::BackFacePolicy> *)(in_RDI + 0x15e8));
    (**(code **)(*plVar4 + 0x68))(plVar4,*pBVar2 == Cull);
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RDI);
    Structure::setStructureUniforms(in_stack_00000520,in_stack_00000518);
    peVar3 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4702fd);
    (*peVar3->_vptr_ShaderProgram[0x24])();
    (**(code **)(*render::engine + 0x68))(render::engine,0);
  }
  return;
}

Assistant:

void SurfaceMesh::drawPick() {
  if (!isEnabled()) {
    return;
  }

  if (pickProgram == nullptr) {
    preparePick();
  }

  render::engine->setBackfaceCull(backFacePolicy.get() == BackFacePolicy::Cull);

  // Set uniforms
  setStructureUniforms(*pickProgram);

  pickProgram->draw();

  render::engine->setBackfaceCull(); // return to default setting
}